

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O0

int ASN1_STRING_cmp(ASN1_STRING *a,ASN1_STRING *b)

{
  byte local_2a;
  byte local_29;
  int ret;
  uint8_t b_padding;
  int iStack_24;
  uint8_t a_padding;
  int b_length;
  int a_length;
  ASN1_STRING *b_local;
  ASN1_STRING *a_local;
  
  iStack_24 = a->length;
  ret = b->length;
  local_29 = 0;
  local_2a = 0;
  _b_length = b;
  b_local = (ASN1_STRING *)a;
  if (a->type == 3) {
    iStack_24 = asn1_bit_string_length((ASN1_BIT_STRING *)a,&local_29);
  }
  if (((ASN1_BIT_STRING *)_b_length)->type == 3) {
    ret = asn1_bit_string_length((ASN1_BIT_STRING *)_b_length,&local_2a);
  }
  if (iStack_24 < ret) {
    a_local._4_4_ = -1;
  }
  else if (ret < iStack_24) {
    a_local._4_4_ = 1;
  }
  else if (local_2a < local_29) {
    a_local._4_4_ = -1;
  }
  else if (local_29 < local_2a) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ =
         OPENSSL_memcmp(b_local->data,((ASN1_BIT_STRING *)_b_length)->data,(long)iStack_24);
    if (a_local._4_4_ == 0) {
      if (b_local->type < ((ASN1_BIT_STRING *)_b_length)->type) {
        a_local._4_4_ = -1;
      }
      else if (((ASN1_BIT_STRING *)_b_length)->type < b_local->type) {
        a_local._4_4_ = 1;
      }
      else {
        a_local._4_4_ = 0;
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

int ASN1_STRING_cmp(const ASN1_STRING *a, const ASN1_STRING *b) {
  // Capture padding bits and implicit truncation in BIT STRINGs.
  int a_length = a->length, b_length = b->length;
  uint8_t a_padding = 0, b_padding = 0;
  if (a->type == V_ASN1_BIT_STRING) {
    a_length = asn1_bit_string_length(a, &a_padding);
  }
  if (b->type == V_ASN1_BIT_STRING) {
    b_length = asn1_bit_string_length(b, &b_padding);
  }

  if (a_length < b_length) {
    return -1;
  }
  if (a_length > b_length) {
    return 1;
  }
  // In a BIT STRING, the number of bits is 8 * length - padding. Invert this
  // comparison so we compare by lengths.
  if (a_padding > b_padding) {
    return -1;
  }
  if (a_padding < b_padding) {
    return 1;
  }

  int ret = OPENSSL_memcmp(a->data, b->data, a_length);
  if (ret != 0) {
    return ret;
  }

  // Comparing the type first is more natural, but this matches OpenSSL.
  if (a->type < b->type) {
    return -1;
  }
  if (a->type > b->type) {
    return 1;
  }
  return 0;
}